

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerManager.cpp
# Opt level: O1

bool __thiscall ServerManager::addServer(ServerManager *this,string_view serverConfig)

{
  char cVar1;
  Config *in_primary_section;
  Config *in_secondary_section;
  IRC_Bot *this_00;
  __single_object server;
  _Head_base<0UL,_IRC_Bot_*,_false> local_30;
  
  in_primary_section =
       (Config *)Jupiter::Config::getSection(this->m_config,serverConfig._M_len,serverConfig._M_str)
  ;
  in_secondary_section = (Config *)Jupiter::Config::getSection(this->m_config,7,"Default");
  this_00 = (IRC_Bot *)operator_new(0x378);
  IRC_Bot::IRC_Bot(this_00,in_primary_section,in_secondary_section);
  local_30._M_head_impl = this_00;
  cVar1 = Jupiter::IRC::Client::connect();
  if (cVar1 != '\0') {
    std::
    vector<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>,std::allocator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>>>
    ::emplace_back<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>>
              ((vector<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>,std::allocator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>>>
                *)&this->m_servers,(unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *)&local_30);
  }
  if (local_30._M_head_impl != (IRC_Bot *)0x0) {
    (**(code **)(*(long *)local_30._M_head_impl + 0x10))();
  }
  return (bool)cVar1;
}

Assistant:

bool ServerManager::addServer(std::string_view serverConfig) {
	auto server = std::make_unique<IRC_Bot>(m_config->getSection(serverConfig), m_config->getSection("Default"sv));
	if (server->connect()) {
		m_servers.push_back(std::move(server));
		return true;
	}

	return false;
}